

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalPtr<double,_int>::SignalPtr
          (SignalPtr<double,_int> *this,Signal<double,_int> *ptr,string *name)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  Signal<double,_int>::Signal((Signal<double,_int> *)&this->field_0x28,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  this->_vptr_SignalPtr = (_func_int **)0x134358;
  *(undefined8 *)&this->field_0x28 = 0x134528;
  this->signalPtr = ptr;
  this->modeNoThrow = false;
  this->transmitAbstract = false;
  this->abstractTransmitter = (SignalBase<int> *)0x0;
  return;
}

Assistant:

SignalPtr(Signal<T, Time> *ptr, std::string name = "")
      : Signal<T, Time>(name),
        signalPtr(ptr),
        modeNoThrow(false),
        transmitAbstract(false),
        abstractTransmitter(NULL) {}